

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall GlobOpt::ForwardPass(GlobOpt *this)

{
  Type *this_00;
  JitArenaAllocator *pJVar1;
  Type pBVar2;
  code *pcVar3;
  BasicBlock *block;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  RegSlot RVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  SparseArray<Value> *pSVar10;
  BVSparse<Memory::JitArenaAllocator> *pBVar11;
  undefined4 *puVar12;
  BVSparseNode *pBVar13;
  uint32 chunkSize;
  BVSparseNode *pBVar14;
  uint uVar15;
  BasicBlock *pBVar16;
  uint uVar17;
  undefined1 local_258 [8];
  IntConstantToStackSymMap localIntConstantToStackSymMap;
  IntConstantToValueMap localIntConstantToValueMap;
  Int64ConstantToValueMap localInt64ConstantToValueMap;
  AddrConstantToValueMap localAddrConstantToValueMap;
  StringConstantToValueMap localStringConstantToValueMap;
  SymIdToInstrMap localPrePassInstrMap;
  ValueSetByValueNumber localValuesCreatedForClone;
  ValueNumberPairToValueMap localValuesCreatedForMerge;
  OpndList localNoImplicitCallUsesToInsert;
  AutoCodeGenPhase __autoCodeGen;
  BVSparse<Memory::JitArenaAllocator> localFinishedStackLiteralInitFld;
  
  localNoImplicitCallUsesToInsert._40_8_ = this->func;
  __autoCodeGen.func._0_4_ = 0x68;
  Func::BeginPhase((Func *)localNoImplicitCallUsesToInsert._40_8_,ForwardPhase);
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar5,uVar6);
  if (bVar4) {
    Func::DumpHeader(this->func);
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,GlobOptPhase);
  if (bVar4) {
    TraceSettings(this);
  }
  pJVar1 = this->alloc;
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  RVar7 = JITTimeFunctionBody::GetConstCount(pJVar8);
  chunkSize = 0x40;
  if (0x40 < RVar7) {
    chunkSize = RVar7;
  }
  pSVar10 = SparseArray<Value>::New(&pJVar1->super_ArenaAllocator,chunkSize);
  this->byteCodeConstantValueArray = pSVar10;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->byteCodeConstantValueNumbersBv = pBVar11;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->tempBv = pBVar11;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->prePassCopyPropSym = pBVar11;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->slotSyms = pBVar11;
  this->byteCodeUses = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->propertySymUse = (PropertySym *)0x0;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->changedSymsAfterIncBailoutCandidate = pBVar11;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->auxSlotPtrSyms = pBVar11;
  pBVar11 = (BVSparse<Memory::JitArenaAllocator> *)
            new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3f1274);
  pJVar1 = this->alloc;
  pBVar11->head = (Type_conflict)0x0;
  pBVar11->lastFoundIndex = (Type_conflict)0x0;
  pBVar11->alloc = pJVar1;
  pBVar11->lastUsedNodePrevNextField = (Type)pBVar11;
  this->byteCodeUsesBeforeOpt = pBVar11;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,FieldCopyPropPhase);
  if ((bVar4) && (bVar4 = DoFunctionFieldCopyProp(this), bVar4)) {
    Output::Print(L"TRACE: CanDoFieldCopyProp Func: ");
    Func::DumpFullFunctionName(this->func);
    Output::Print(L"\n");
  }
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_ = this->alloc;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._vptr_ReadOnlyList =
       (_func_int **)0x0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.buffer._0_4_ = 0;
  localValuesCreatedForMerge.stats = (Type)&PTR_IsReadOnly_014ea4b0;
  localNoImplicitCallUsesToInsert.
  super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>.alloc =
       (Type)0x400000000;
  this->noImplicitCallUsesToInsert = (OpndList *)&localValuesCreatedForMerge.stats;
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)local_258,
                   (AllocatorType *)
                   localNoImplicitCallUsesToInsert.
                   super_ReadOnlyList<IR::Opnd_*,_Memory::JitArenaAllocator,_DefaultComparer>._16_8_
                   ,0);
  this->intConstantToStackSymMap =
       (BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)local_258;
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToStackSymMap.stats,this->alloc,0);
  this->intConstantToValueMap = (IntConstantToValueMap *)&localIntConstantToStackSymMap.stats;
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localIntConstantToValueMap.stats,this->alloc,0);
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)&localIntConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localInt64ConstantToValueMap.stats,this->alloc,0);
  this->addrConstantToValueMap = (AddrConstantToValueMap *)&localInt64ConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localAddrConstantToValueMap.stats,this->alloc,0);
  this->stringConstantToValueMap = (StringConstantToValueMap *)&localAddrConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)&localStringConstantToValueMap.stats,this->alloc,0);
  this->prePassInstrMap = (SymIdToInstrMap *)&localStringConstantToValueMap.stats;
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    *)&localPrePassInstrMap.stats,this->alloc,0x40);
  this->valuesCreatedForClone = (ValueSetByValueNumber *)&localPrePassInstrMap.stats;
  this_00 = &localValuesCreatedForClone.
             super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .stats;
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    *)this_00,this->alloc,0x40);
  this->valuesCreatedForMerge = (ValueNumberPairToValueMap *)this_00;
  pJVar1 = this->alloc;
  __autoCodeGen.phase = AllPhase;
  __autoCodeGen.dump = false;
  __autoCodeGen.isPhaseComplete = false;
  __autoCodeGen._12_4_ = 0;
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)&__autoCodeGen.phase;
  pBVar16 = this->func->m_fg->blockList;
  while (block = pBVar16, block != (BasicBlock *)0x0) {
    pBVar16 = block->next;
    if ((block->field_0x18 & 1) == 0) {
      OptBlock(this,block);
    }
  }
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,MemOpPhase,uVar5,uVar6);
  if (!bVar4) {
    ProcessMemOp(this);
  }
  this->noImplicitCallUsesToInsert = (OpndList *)0x0;
  this->stringConstantToValueMap = (StringConstantToValueMap *)0x0;
  this->finishedStackLiteralInitFld = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->int64ConstantToValueMap = (Int64ConstantToValueMap *)0x0;
  this->addrConstantToValueMap = (AddrConstantToValueMap *)0x0;
  this->intConstantToStackSymMap = (IntConstantToStackSymMap *)0x0;
  this->intConstantToValueMap = (IntConstantToValueMap *)0x0;
  pBVar16 = this->func->m_fg->blockList;
  if (pBVar16 == (BasicBlock *)0x0) {
    uVar15 = 0;
    uVar17 = 0;
  }
  else {
    uVar17 = 0;
    uVar15 = 0;
    do {
      if ((pBVar16->field_0x18 & 1) == 0) {
        bVar4 = pBVar16->dataUseCount == 0;
        uVar15 = uVar15 + bVar4;
        uVar17 = uVar17 + !bVar4;
        pBVar16->dataUseCount = 0;
        if (pBVar16->cloneStrCandidates != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->alloc,pBVar16->cloneStrCandidates);
          pBVar16->cloneStrCandidates = (BVSparse<Memory::JitArenaAllocator> *)0x0;
        }
      }
      pBVar16 = pBVar16->next;
    } while (pBVar16 != (BasicBlock *)0x0);
  }
  if (uVar15 < uVar17) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1bb,"(freedCount >= spilledCount)","freedCount >= spilledCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
  }
  this->changedSymsAfterIncBailoutCandidate = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->auxSlotPtrSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&localNoImplicitCallUsesToInsert.field_0x28,this->func,ForwardPhase
             ,true,true);
  if (__autoCodeGen._8_8_ != 0) {
    pBVar2 = (Type)__autoCodeGen._8_8_;
    pBVar14 = pJVar1->bvFreeList;
    do {
      pBVar13 = pBVar2;
      pBVar2 = pBVar13->next;
      pBVar13->next = pBVar14;
      pBVar14 = pBVar13;
    } while (pBVar2 != (Type)0x0);
    pJVar1->bvFreeList = pBVar13;
  }
  JsUtil::
  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localValuesCreatedForClone.
                        super_BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        .stats);
  JsUtil::
  BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                     *)&localPrePassInstrMap.stats);
  JsUtil::
  BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localStringConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localAddrConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<void_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localInt64ConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToValueMap.stats);
  JsUtil::
  BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<int,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&localIntConstantToStackSymMap.stats);
  JsUtil::
  BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<long,_StackSym_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)local_258);
  localValuesCreatedForMerge.stats = (Type)&PTR_IsReadOnly_014ea4b0;
  JsUtil::List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Reset((List<IR::Opnd_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *)&localValuesCreatedForMerge.stats);
  AutoCodeGenPhase::~AutoCodeGenPhase
            ((AutoCodeGenPhase *)&localNoImplicitCallUsesToInsert.field_0x28);
  return;
}

Assistant:

void
GlobOpt::ForwardPass()
{
    BEGIN_CODEGEN_PHASE(this->func, Js::ForwardPhase);

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId()))
    {
        this->func->DumpHeader();
    }
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::GlobOptPhase))
    {
        this->TraceSettings();
    }
#endif

    // GetConstantCount() gives us the right size to pick for the SparseArray, but we may need more if we've inlined
    // functions with constants. There will be a gap in the symbol numbering between the main constants and
    // the inlined ones, so we'll most likely need a new array chunk. Make the min size of the array chunks be 64
    // in case we have a main function with very few constants and a bunch of constants from inlined functions.
    this->byteCodeConstantValueArray = SparseArray<Value>::New(this->alloc, max(this->func->GetJITFunctionBody()->GetConstCount(), 64U));
    this->byteCodeConstantValueNumbersBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->tempBv = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->prePassCopyPropSym = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->slotSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    this->byteCodeUses = nullptr;
    this->propertySymUse = nullptr;

    // changedSymsAfterIncBailoutCandidate helps track building incremental bailout in ForwardPass
    this->changedSymsAfterIncBailoutCandidate = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->auxSlotPtrSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

#if DBG
    this->byteCodeUsesBeforeOpt = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase) && this->DoFunctionFieldCopyProp())
    {
        Output::Print(_u("TRACE: CanDoFieldCopyProp Func: "));
        this->func->DumpFullFunctionName();
        Output::Print(_u("\n"));
    }
#endif

    OpndList localNoImplicitCallUsesToInsert(alloc);
    this->noImplicitCallUsesToInsert = &localNoImplicitCallUsesToInsert;
    IntConstantToStackSymMap localIntConstantToStackSymMap(alloc);
    this->intConstantToStackSymMap = &localIntConstantToStackSymMap;
    IntConstantToValueMap localIntConstantToValueMap(alloc);
    this->intConstantToValueMap = &localIntConstantToValueMap;
    Int64ConstantToValueMap localInt64ConstantToValueMap(alloc);
    this->int64ConstantToValueMap = &localInt64ConstantToValueMap;
    AddrConstantToValueMap localAddrConstantToValueMap(alloc);
    this->addrConstantToValueMap = &localAddrConstantToValueMap;
    StringConstantToValueMap localStringConstantToValueMap(alloc);
    this->stringConstantToValueMap = &localStringConstantToValueMap;
    SymIdToInstrMap localPrePassInstrMap(alloc);
    this->prePassInstrMap = &localPrePassInstrMap;
    ValueSetByValueNumber localValuesCreatedForClone(alloc, 64);
    this->valuesCreatedForClone = &localValuesCreatedForClone;
    ValueNumberPairToValueMap localValuesCreatedForMerge(alloc, 64);
    this->valuesCreatedForMerge = &localValuesCreatedForMerge;

#if DBG
    BVSparse<JitArenaAllocator> localFinishedStackLiteralInitFld(alloc);
    this->finishedStackLiteralInitFld = &localFinishedStackLiteralInitFld;
#endif

    FOREACH_BLOCK_IN_FUNC_EDITING(block, this->func)
    {
        this->OptBlock(block);
    } NEXT_BLOCK_IN_FUNC_EDITING;

    if (!PHASE_OFF(Js::MemOpPhase, this->func))
    {
        ProcessMemOp();
    }

    this->noImplicitCallUsesToInsert = nullptr;
    this->intConstantToStackSymMap = nullptr;
    this->intConstantToValueMap = nullptr;
    this->int64ConstantToValueMap = nullptr;
    this->addrConstantToValueMap = nullptr;
    this->stringConstantToValueMap = nullptr;
#if DBG
    this->finishedStackLiteralInitFld = nullptr;
    uint freedCount = 0;
    uint spilledCount = 0;
#endif

    FOREACH_BLOCK_IN_FUNC(block, this->func)
    {
#if DBG
        if (block->GetDataUseCount() == 0)
        {
            freedCount++;
        }
        else
        {
            spilledCount++;
        }
#endif
        block->SetDataUseCount(0);
        if (block->cloneStrCandidates)
        {
            JitAdelete(this->alloc, block->cloneStrCandidates);
            block->cloneStrCandidates = nullptr;
        }
    } NEXT_BLOCK_IN_FUNC;

    // Make sure we free most of them.
    Assert(freedCount >= spilledCount);

    // this->alloc will be freed right after return, no need to free it here
    this->changedSymsAfterIncBailoutCandidate = nullptr;
    this->auxSlotPtrSyms = nullptr;

    END_CODEGEN_PHASE(this->func, Js::ForwardPhase);
}